

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::SwapCoordinates(ON_PolyCurve *this,int i,int j)

{
  ON_Curve *pOVar1;
  char cVar2;
  ulong uVar4;
  ulong uVar5;
  int iVar3;
  
  uVar4 = (ulong)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  cVar2 = 0 < (long)uVar4;
  if (0 < (long)uVar4) {
    uVar5 = 1;
    do {
      pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar5 - 1];
      iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1f])
                        (pOVar1,(ulong)(uint)i,(ulong)(uint)j);
      cVar2 = (char)iVar3;
      if (uVar4 <= uVar5) break;
      uVar5 = uVar5 + 1;
    } while (cVar2 != '\0');
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return (bool)cVar2;
}

Assistant:

bool
ON_PolyCurve::SwapCoordinates( int i, int j )
{
  const int count = Count();
  int segment_index;
  bool rc = (count>0) ? true : false;
  for ( segment_index = 0; segment_index < count && rc; segment_index++ ) {
    rc = m_segment[segment_index]->SwapCoordinates( i, j );
  }
	DestroyCurveTree();
  return rc;
}